

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_PermutationElement_Test::TestBody(Sampling_PermutationElement_Test *this)

{
  bool bVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference rVar2;
  reference rVar3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int offset;
  int i;
  vector<bool,_std::allocator<bool>_> seen;
  int iter;
  int len;
  _Bit_type in_stack_fffffffffffffea8;
  _Bit_type *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  _Bit_type in_stack_fffffffffffffec0;
  _Bit_type *in_stack_fffffffffffffec8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffed0;
  Type in_stack_fffffffffffffedc;
  AssertHelper *in_stack_fffffffffffffee0;
  reference local_100;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  AssertionResult *in_stack_ffffffffffffff28;
  AssertHelper *in_stack_ffffffffffffff30;
  reference local_c0;
  AssertionResult local_b0;
  uint local_9c;
  string local_98 [48];
  AssertionResult local_68;
  int local_54;
  uint32_t local_50;
  undefined1 local_39;
  uint32_t local_10;
  uint32_t local_c;
  
  rVar2._M_mask = in_stack_fffffffffffffec0;
  rVar2._M_p = in_stack_fffffffffffffec8;
  rVar3._M_mask = in_stack_fffffffffffffea8;
  rVar3._M_p = in_stack_fffffffffffffeb0;
  local_c = 2;
  do {
    if (0x3ff < (int)local_c) {
      return;
    }
    for (local_10 = 0; (int)local_10 < 10; local_10 = local_10 + 1) {
      this_00 = (vector<bool,_std::allocator<bool>_> *)(long)(int)local_c;
      local_39 = 0;
      std::allocator<bool>::allocator((allocator<bool> *)0x644e1b);
      std::vector<bool,_std::allocator<bool>_>::vector
                (in_stack_fffffffffffffed0,(size_type)rVar2._M_p,(bool *)rVar2._M_mask,
                 (allocator_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::allocator<bool>::~allocator((allocator<bool> *)0x644e49);
      for (local_50 = 0; (int)local_50 < (int)local_c; local_50 = local_50 + 1) {
        local_54 = pbrt::PermutationElement(local_50,local_c,local_10);
        if (-1 < local_54) {
          in_stack_fffffffffffffee0 = (AssertHelper *)(long)local_54;
          std::vector<bool,_std::allocator<bool>_>::size(this_00);
        }
        testing::AssertionResult::AssertionResult((AssertionResult *)rVar3._M_p,rVar3._M_mask._7_1_)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
        in_stack_fffffffffffffedc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffee0);
          in_stack_fffffffffffffed0 =
               (vector<bool,_std::allocator<bool>_> *)
               testing::Message::operator<<((Message *)rVar3._M_p,(int *)rVar3._M_mask);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                     (char *)in_stack_fffffffffffffed0,rVar2._M_p._4_4_,(char *)rVar2._M_mask);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)rVar3._M_p);
          std::__cxx11::string::~string(local_98);
          testing::Message::~Message((Message *)0x645024);
        }
        local_9c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x6450b5);
        if (local_9c != 0) goto LAB_006452f6;
        rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffed0,(size_type)rVar2._M_p);
        local_c0 = rVar2;
        std::_Bit_reference::operator_cast_to_bool(&local_c0);
        testing::AssertionResult::AssertionResult((AssertionResult *)rVar3._M_p,rVar3._M_mask._7_1_)
        ;
        in_stack_fffffffffffffebf = testing::AssertionResult::operator_cast_to_bool(&local_b0);
        if (!(bool)in_stack_fffffffffffffebf) {
          testing::Message::Message((Message *)in_stack_fffffffffffffee0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                     (char *)in_stack_fffffffffffffed0,rVar2._M_p._4_4_,(char *)rVar2._M_mask);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)rVar3._M_p);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
          testing::Message::~Message((Message *)0x64520f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x645284);
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffed0,(size_type)rVar2._M_p);
        local_100 = rVar3;
        std::_Bit_reference::operator=(&local_100,true);
      }
      local_9c = 0;
LAB_006452f6:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x645303);
      if (local_9c != 0) {
        return;
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

TEST(Sampling, PermutationElement) {
    for (int len = 2; len < 1024; ++len) {
        for (int iter = 0; iter < 10; ++iter) {
            std::vector<bool> seen(len, false);

            for (int i = 0; i < len; ++i) {
                int offset = PermutationElement(i, len, iter);
                ASSERT_TRUE(offset >= 0 && offset < seen.size()) << offset;
                EXPECT_FALSE(seen[offset]);
                seen[offset] = true;
            }
        }
    }
}